

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

aiMatrix4x4 * Read<aiMatrix4x4t<float>>(aiMatrix4x4 *__return_storage_ptr__,IOStream *stream)

{
  float *pfVar1;
  float fVar2;
  uint local_18;
  uint local_14;
  uint i2;
  uint i;
  IOStream *stream_local;
  
  aiMatrix4x4t<float>::aiMatrix4x4t(__return_storage_ptr__);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      fVar2 = Read<float>(stream);
      pfVar1 = aiMatrix4x4t<float>::operator[](__return_storage_ptr__,local_14);
      pfVar1[local_18] = fVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 Read<aiMatrix4x4>(IOStream * stream) {
    aiMatrix4x4 m;
    for (unsigned int i = 0; i < 4;++i) {
        for (unsigned int i2 = 0; i2 < 4;++i2) {
            m[i][i2] = Read<float>(stream);
        }
    }
    return m;
}